

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O1

void amrex::sundials::MemoryHelper::Initialize(int nthreads)

{
  SUNMemoryHelper_Ops p_Var1;
  undefined8 *puVar2;
  Context *pCVar3;
  SUNMemoryHelper p_Var4;
  ulong uVar5;
  
  if (DAT_0083d2d8 == (anonymous_namespace)::initialized) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::initialized,
               (long)nthreads);
    if ((anonymous_namespace)::initialized != DAT_0083d2d8) {
      memset((anonymous_namespace)::initialized,0,
             ((long)DAT_0083d2d8 + (-4 - (long)(anonymous_namespace)::initialized) &
             0xfffffffffffffffcU) + 4);
    }
    std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>::
    resize((vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>
            *)&(anonymous_namespace)::the_sunmemory_helper,(long)nthreads);
    if ((anonymous_namespace)::the_sunmemory_helper != DAT_0083d2f0) {
      memset((anonymous_namespace)::the_sunmemory_helper,0,
             (long)DAT_0083d2f0 - (long)(anonymous_namespace)::the_sunmemory_helper &
             0xfffffffffffffff8);
    }
  }
  if (0 < nthreads) {
    uVar5 = 0;
    do {
      if (*(int *)((long)(anonymous_namespace)::initialized + uVar5 * 4) == 0) {
        *(undefined4 *)((long)(anonymous_namespace)::initialized + uVar5 * 4) = 1;
        puVar2 = (undefined8 *)operator_new(0x10);
        pCVar3 = The_Sundials_Context((int)uVar5);
        *puVar2 = pCVar3;
        p_Var4 = SUNMemoryHelper_NewEmpty
                           (*(pCVar3->sunctx_)._M_t.
                             super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                             ._M_t.
                             super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                             .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
        p_Var4->content = (void *)0x0;
        p_Var1 = p_Var4->ops;
        p_Var1->clone = anon_unknown_0::CloneMemoryHelper;
        p_Var1->alloc = anon_unknown_0::Alloc;
        p_Var1->dealloc = anon_unknown_0::Dealloc;
        p_Var1->destroy = anon_unknown_0::DestroyMemoryHelper;
        puVar2[1] = p_Var4;
        *(undefined8 **)((long)(anonymous_namespace)::the_sunmemory_helper + uVar5 * 8) = puVar2;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)nthreads != uVar5);
  }
  return;
}

Assistant:

void MemoryHelper::Initialize(int nthreads)
{
    if (initialized.size() == 0) {
        initialized.resize(nthreads);
        std::fill(initialized.begin(), initialized.end(), 0);
        the_sunmemory_helper.resize(nthreads);
        std::fill(the_sunmemory_helper.begin(), the_sunmemory_helper.end(), nullptr);
    }
    for (int i = 0; i < nthreads; i++) {
        if (initialized[i]) continue;
        initialized[i] = 1;
        BL_ASSERT(the_sunmemory_helper[i] == nullptr);
        the_sunmemory_helper[i] = new MemoryHelper(The_Sundials_Context(i));
    }
}